

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallSet.h
# Opt level: O3

pair<llvm::NoneType,_bool> __thiscall
llvm::SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_>::insert
          (SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> *this,
          pair<int,_int> *V)

{
  uint uVar1;
  ulong uVar2;
  undefined8 uVar3;
  long lVar5;
  uint uVar6;
  pair<llvm::NoneType,_bool> pVar8;
  int iVar10;
  undefined1 auVar9 [16];
  pair<std::_Rb_tree_iterator<std::pair<int,_int>_>,_bool> pVar11;
  undefined8 uVar4;
  SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> *pSVar7;
  
  if ((this->Set)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    uVar1 = (this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
            super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
            super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.super_SmallVectorBase.Size;
    uVar2 = (ulong)uVar1;
    if (uVar2 != 0) {
      lVar5 = 0;
      pSVar7 = this;
      do {
        uVar3 = *(undefined8 *)
                 ((long)(this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
                        super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
                        super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.
                        super_SmallVectorBase.BeginX + lVar5);
        auVar9._0_4_ = -(uint)((int)uVar3 == (*V).first);
        iVar10 = -(uint)((int)((ulong)uVar3 >> 0x20) == (*V).second);
        auVar9._4_4_ = auVar9._0_4_;
        auVar9._8_4_ = iVar10;
        auVar9._12_4_ = iVar10;
        uVar6 = movmskpd((int)pSVar7,auVar9);
        pSVar7 = (SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> *)
                 (ulong)uVar6;
        if (uVar6 == 3) {
          if (uVar2 << 3 != lVar5) {
            uVar3._0_4_ = None;
            uVar3._4_1_ = false;
            uVar3._5_3_ = 0;
            return (pair<llvm::NoneType,_bool>)uVar3;
          }
          break;
        }
        lVar5 = lVar5 + 8;
      } while (uVar2 << 3 != lVar5);
      if (0x1f < uVar1) {
        do {
          std::
          _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
          ::_M_insert_unique<std::pair<int,int>const&>
                    ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                      *)&this->Set,
                     (pair<int,_int> *)
                     ((long)(this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
                            super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
                            super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.
                            super_SmallVectorBase.BeginX + (uVar2 & 0xffffffff) * 8 + -8));
          uVar2 = (ulong)(this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
                         super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
                         super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.
                         super_SmallVectorBase.Size - 1;
          if ((this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
              super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
              super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.super_SmallVectorBase.
              Capacity < uVar2) {
            __assert_fail("Size <= capacity()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
          }
          (this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
          super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
          super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.super_SmallVectorBase.Size =
               (uint)uVar2;
        } while ((uint)uVar2 != 0);
        std::
        _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
        ::_M_insert_unique<std::pair<int,int>const&>
                  ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                    *)&this->Set,V);
        uVar4._0_4_ = None;
        uVar4._4_1_ = true;
        uVar4._5_3_ = 0;
        return (pair<llvm::NoneType,_bool>)uVar4;
      }
    }
    pVar8.first = None;
    pVar8.second = true;
    pVar8._5_3_ = 0;
    SmallVectorTemplateBase<std::pair<int,_int>,_true>::push_back
              ((SmallVectorTemplateBase<std::pair<int,_int>,_true> *)this,V);
  }
  else {
    pVar11 = std::
             _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
             ::_M_insert_unique<std::pair<int,int>const&>
                       ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                         *)&this->Set,V);
    pVar8 = (pair<llvm::NoneType,_bool>)(((ulong)pVar11.second << 0x20) + 1);
  }
  return pVar8;
}

Assistant:

std::pair<NoneType, bool> insert(const T &V) {
    if (!isSmall())
      return std::make_pair(None, Set.insert(V).second);

    VIterator I = vfind(V);
    if (I != Vector.end())    // Don't reinsert if it already exists.
      return std::make_pair(None, false);
    if (Vector.size() < N) {
      Vector.push_back(V);
      return std::make_pair(None, true);
    }

    // Otherwise, grow from vector to set.
    while (!Vector.empty()) {
      Set.insert(Vector.back());
      Vector.pop_back();
    }
    Set.insert(V);
    return std::make_pair(None, true);
  }